

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avl_tree.c
# Opt level: O3

NodeAVL * avlRotateRight(NodeAVL *p)

{
  NodeAVL *pNVar1;
  NodeAVL *pNVar2;
  int iVar3;
  NodeAVL *pNVar4;
  int iVar5;
  int iVar6;
  
  pNVar1 = p->left;
  pNVar2 = pNVar1->right;
  p->left = pNVar2;
  if (pNVar2 == (NodeAVL *)0x0) {
    pNVar1->right = p;
    pNVar4 = p->parent;
    p->parent = pNVar1;
    iVar6 = 0;
  }
  else {
    pNVar2->parent = p;
    pNVar1->right = p;
    pNVar4 = p->parent;
    p->parent = pNVar1;
    iVar6 = pNVar2->height;
  }
  pNVar1->parent = pNVar4;
  iVar5 = 0;
  iVar3 = 0;
  if (p->right != (NodeAVL *)0x0) {
    iVar3 = p->right->height;
  }
  if (iVar3 < iVar6) {
    iVar3 = iVar6;
  }
  iVar3 = iVar3 + 1;
  p->height = iVar3;
  if (pNVar1->left != (NodeAVL *)0x0) {
    iVar5 = pNVar1->left->height;
  }
  if (iVar3 < iVar5) {
    iVar3 = iVar5;
  }
  pNVar1->height = iVar3 + 1;
  return pNVar1;
}

Assistant:

static
NodeAVL* avlRotateRight( NodeAVL* p ){
    #ifdef DEBUG_AVL
      printf( "avlRotateRight id=%d\n", p->id );
    #endif
    NodeAVL* q = p->left;
    p->left = q->right;
    if( q->right ) q->right->parent = p;
    q->right = p;
    NodeAVL* pp = p->parent;
    p->parent = q;
    q->parent = pp;
    avlFixHeight(p);
    avlFixHeight(q);
    return q;
}